

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall kratos::Simulator::init_pull_up_value(Simulator *this,Generator *generator)

{
  IRVisitor local_78;
  Simulator *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  local_78.visited_._M_h._M_buckets = &local_78.visited_._M_h._M_single_bucket;
  local_78.level = 0;
  local_78.visited_._M_h._M_bucket_count = 1;
  local_78.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78.visited_._M_h._M_element_count = 0;
  local_78.visited_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_78.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_78.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_78._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b1db8;
  local_18 = std::
             _Function_handler<void_(kratos::AssignStmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/sim.cc:760:15)>
             ::_M_invoke;
  local_28 = 0;
  local_20 = std::
             _Function_handler<void_(kratos::AssignStmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/sim.cc:760:15)>
             ::_M_manager;
  local_30 = this;
  IRVisitor::visit_generator_root(&local_78,generator);
  local_78._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b1db8;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  local_78._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b0528;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_78.visited_._M_h);
  return;
}

Assistant:

void Simulator::init_pull_up_value(Generator *generator) {
    auto fn = [&](AssignStmt *stmt) { this->process_stmt(stmt, nullptr); };
    InitValueVisitor visitor(fn);
    visitor.visit_generator_root(generator);
}